

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O0

art_erase_result_t art_erase_at(art_node_t *node,art_key_chunk_t *key,uint8_t depth)

{
  _Bool _Var1;
  uint8_t uVar2;
  art_node_t aVar3;
  art_inner_node_t *paVar4;
  art_inner_node_t *node_00;
  uint8_t in_DL;
  art_node_t *in_RSI;
  art_node_t *in_RDI;
  art_erase_result_t aVar5;
  art_erase_result_t child_result;
  art_node_t *child;
  art_key_chunk_t key_chunk;
  uint8_t common_prefix;
  art_inner_node_t *inner_node;
  uint8_t common_prefix_1;
  art_leaf_t *leaf;
  art_erase_result_t result;
  art_inner_node_t *new_child;
  undefined1 in_stack_ffffffffffffffa0 [16];
  unkbyte9 Var6;
  art_inner_node_t *node_01;
  undefined8 in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffd8;
  art_node_t *local_10;
  art_inner_node_t *local_8;
  
  uVar2 = (uint8_t)((ulong)in_stack_ffffffffffffffd0 >> 0x38);
  Var6 = in_stack_ffffffffffffffa0._7_9_;
  local_10 = (art_node_t *)0x0;
  local_8 = (art_inner_node_t *)0x0;
  _Var1 = art_is_leaf(in_RDI);
  paVar4 = local_8;
  if (_Var1) {
    paVar4 = (art_inner_node_t *)((ulong)in_RDI & 0xfffffffffffffffe);
    uVar2 = art_common_prefix((art_key_chunk_t *)paVar4,'\0','\x06',(art_key_chunk_t *)in_RSI,'\0',
                              '\x06');
    if (uVar2 != '\x06') {
      paVar4 = local_8;
    }
  }
  else {
    aVar3 = (art_node_t)
            art_common_prefix((art_key_chunk_t *)(in_RDI + 2),'\0',(uint8_t)in_RDI[1],
                              (art_key_chunk_t *)in_RSI,in_DL,'\x06');
    if ((aVar3 == in_RDI[1]) &&
       (node_00 = (art_inner_node_t *)
                  art_find_child((art_inner_node_t *)((unkuint9)Var6 >> 8),(art_key_chunk_t)Var6),
       node_00 != (art_inner_node_t *)0x0)) {
      aVar5 = art_erase_at(in_RSI,(art_key_chunk_t *)CONCAT17(in_DL,in_stack_ffffffffffffffd8),uVar2
                          );
      node_01 = (art_inner_node_t *)aVar5.value_erased;
      if (node_01 != (art_inner_node_t *)0x0) {
        new_child = (art_inner_node_t *)aVar5.rootmost_node;
        paVar4 = node_01;
        if (new_child == (art_inner_node_t *)0x0) {
          local_10 = art_node_erase(node_01,aVar5.rootmost_node._7_1_);
        }
        else {
          local_10 = in_RDI;
          if (new_child != node_00) {
            art_replace(node_00,aVar5.value_erased._7_1_,(art_node_t *)new_child);
          }
        }
      }
    }
  }
  local_8 = paVar4;
  aVar5.value_erased = (art_val_t *)local_8;
  aVar5.rootmost_node = local_10;
  return aVar5;
}

Assistant:

static art_erase_result_t art_erase_at(art_node_t *node,
                                       const art_key_chunk_t *key,
                                       uint8_t depth) {
    art_erase_result_t result;
    result.rootmost_node = NULL;
    result.value_erased = NULL;

    if (art_is_leaf(node)) {
        art_leaf_t *leaf = CAST_LEAF(node);
        uint8_t common_prefix = art_common_prefix(leaf->key, 0, ART_KEY_BYTES,
                                                  key, 0, ART_KEY_BYTES);
        if (common_prefix != ART_KEY_BYTES) {
            // Leaf key mismatch.
            return result;
        }
        result.value_erased = (art_val_t *)leaf;
        return result;
    }
    art_inner_node_t *inner_node = (art_inner_node_t *)node;
    uint8_t common_prefix =
        art_common_prefix(inner_node->prefix, 0, inner_node->prefix_size, key,
                          depth, ART_KEY_BYTES);
    if (common_prefix != inner_node->prefix_size) {
        // Prefix mismatch.
        return result;
    }
    art_key_chunk_t key_chunk = key[depth + common_prefix];
    art_node_t *child = art_find_child(inner_node, key_chunk);
    if (child == NULL) {
        // No child with key chunk.
        return result;
    }
    // Try to erase the key further down. Skip the key chunk associated with the
    // child in the node.
    art_erase_result_t child_result =
        art_erase_at(child, key, depth + common_prefix + 1);
    if (child_result.value_erased == NULL) {
        return result;
    }
    result.value_erased = child_result.value_erased;
    result.rootmost_node = node;
    if (child_result.rootmost_node == NULL) {
        // Child node was fully erased, erase it from this node's children.
        result.rootmost_node = art_node_erase(inner_node, key_chunk);
    } else if (child_result.rootmost_node != child) {
        // Child node was not fully erased, update the pointer to it in this
        // node.
        art_replace(inner_node, key_chunk, child_result.rootmost_node);
    }
    return result;
}